

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O0

void __thiscall
spdlog::details::
elapsed_formatter<spdlog::details::scoped_padder,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>
::format(elapsed_formatter<spdlog::details::scoped_padder,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>
         *this,log_msg *msg,tm *param_3,memory_buf_t *dest)

{
  duration<long,_std::ratio<1L,_1000000000L>_> *pdVar1;
  long in_RSI;
  scoped_padder *in_RDI;
  scoped_padder p;
  size_t n_digits;
  size_t delta_count;
  __enable_if_is_duration<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_> delta_units;
  duration<long,_std::ratio<1L,_1000000000L>_> delta;
  duration<long,_std::ratio<1L,_1000000000L>_> *in_stack_ffffffffffffff68;
  memory_buf_t *in_stack_ffffffffffffff78;
  padding_info *in_stack_ffffffffffffff80;
  size_t in_stack_ffffffffffffff88;
  scoped_padder *in_stack_ffffffffffffff90;
  memory_buf_t *in_stack_ffffffffffffff98;
  unsigned_long in_stack_ffffffffffffffa0;
  duration<long,_std::ratio<1L,_1000000L>_> local_40;
  rep local_38;
  rep local_30;
  rep local_28;
  long local_10;
  
  local_10 = in_RSI;
  local_30 = (rep)std::chrono::operator-
                            ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                              *)in_stack_ffffffffffffff78,
                             (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                              *)in_RDI);
  local_38 = (rep)CLI::std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::zero();
  pdVar1 = std::max<std::chrono::duration<long,std::ratio<1l,1000000000l>>>
                     ((duration<long,_std::ratio<1L,_1000000000L>_> *)in_stack_ffffffffffffff78,
                      (duration<long,_std::ratio<1L,_1000000000L>_> *)in_RDI);
  local_28 = pdVar1->__r;
  local_40.__r = (rep)std::chrono::
                      duration_cast<std::chrono::duration<long,std::ratio<1l,1000000l>>,long,std::ratio<1l,1000000000l>>
                                (in_stack_ffffffffffffff68);
  (in_RDI->spaces_).data_ = *(char **)(local_10 + 0x18);
  std::chrono::duration<long,_std::ratio<1L,_1000000L>_>::count(&local_40);
  scoped_padder::count_digits<unsigned_long>(0x5fbe5c);
  scoped_padder::scoped_padder
            (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
             in_stack_ffffffffffffff78);
  fmt_helper::append_int<unsigned_long>(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  scoped_padder::~scoped_padder(in_RDI);
  return;
}

Assistant:

void format(const details::log_msg &msg, const std::tm &, memory_buf_t &dest) override {
        auto delta = (std::max)(msg.time - last_message_time_, log_clock::duration::zero());
        auto delta_units = std::chrono::duration_cast<DurationUnits>(delta);
        last_message_time_ = msg.time;
        auto delta_count = static_cast<size_t>(delta_units.count());
        auto n_digits = static_cast<size_t>(ScopedPadder::count_digits(delta_count));
        ScopedPadder p(n_digits, padinfo_, dest);
        fmt_helper::append_int(delta_count, dest);
    }